

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

void __thiscall
wasm::StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
          (TypeHierarchyPropagator<wasm::LUBFinder> *this,
          StructValuesMap<wasm::LUBFinder> *combinedInfos,bool toSubTypes,bool toSuperTypes)

{
  long lVar1;
  pointer pLVar2;
  Type TVar3;
  pointer pFVar4;
  pointer pFVar5;
  pointer pHVar6;
  pointer pLVar7;
  bool bVar8;
  StructValues<wasm::LUBFinder> *pSVar9;
  Struct *pSVar10;
  Type TVar11;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar12;
  StructValues<wasm::LUBFinder> *pSVar13;
  uint uVar14;
  pointer pHVar15;
  ulong uVar16;
  __node_base *p_Var17;
  ulong uVar18;
  optional<wasm::HeapType> oVar19;
  undefined1 auStack_128 [8];
  UniqueDeferredQueue<wasm::HeapType> work;
  _Storage<wasm::HeapType,_true> local_98;
  optional<wasm::HeapType> superType;
  HeapType local_48;
  HeapType type;
  StructValuesMap<wasm::LUBFinder> *__range3;
  
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_128 = (undefined1  [8])0x0;
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_initialize_map
            ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128,0);
  work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
  work.count._M_h._M_buckets = (__buckets_ptr)0x1;
  work.count._M_h._M_bucket_count = 0;
  work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  work.count._M_h._M_element_count._0_4_ = 0x3f800000;
  work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  work.count._M_h._M_rehash_policy._4_4_ = 0;
  work.count._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var17 = &(combinedInfos->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
             )._M_h._M_before_begin;
  while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
    UniqueDeferredQueue<wasm::HeapType>::push
              ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128,(HeapType)p_Var17[1]._M_nxt);
  }
  do {
    if (((long)((long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first -
               work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_map_size) >> 3) +
        ((long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node -
         (long)work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur >> 3) +
        ((((ulong)((long)work.data.c.
                         super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last -
                  (long)work.data.c.
                        super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
        (ulong)(work.data.c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x40 == 0)
    {
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&work.data.c.
                               super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 0x18));
      std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Deque_base
                ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128);
      return;
    }
    local_48 = UniqueDeferredQueue<wasm::HeapType>::pop
                         ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128);
    pSVar9 = StructValuesMap<wasm::LUBFinder>::operator[](combinedInfos,local_48);
    if (toSuperTypes) {
      oVar19 = HeapType::getDeclaredSuperType(&local_48);
      local_98 = oVar19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
      superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
           oVar19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      if (((undefined1  [16])
           oVar19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        type.id = (uintptr_t)
                  StructValuesMap<wasm::LUBFinder>::operator[](combinedInfos,local_98._M_value);
        pSVar10 = HeapType::getStruct(&local_98._M_value);
        if ((pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar14 = 1;
          uVar16 = 0;
          do {
            lVar1 = *(long *)type.id;
            if (((ulong)(*(long *)(type.id + 8) - lVar1 >> 3) <= uVar16) ||
               (pLVar2 = (pSVar9->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                         super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                         _M_impl.super__Vector_impl_data._M_start,
               (ulong)((long)(pSVar9->
                             super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                             super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
               uVar16)) {
LAB_00ae250a:
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                            ,0x27,
                            "T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) [T = wasm::LUBFinder]"
                           );
            }
            TVar3.id = *(uintptr_t *)(lVar1 + uVar16 * 8);
            TVar11 = wasm::Type::getLeastUpperBound(TVar3,pLVar2[uVar16].lub.id);
            *(uintptr_t *)(lVar1 + uVar16 * 8) = TVar11.id;
            if (TVar3.id != TVar11.id) {
              UniqueDeferredQueue<wasm::HeapType>::push
                        ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128,local_98._M_value.id);
            }
            uVar16 = (ulong)uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar16 < (ulong)((long)(pSVar10->fields).
                                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar10->fields).
                                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
    }
    if (toSubTypes) {
      pSVar10 = HeapType::getStruct(&local_48);
      pFVar4 = (pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar5 = (pSVar10->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pvVar12 = SubTypes::getImmediateSubTypes(&this->subTypes,local_48);
      pHVar15 = (pvVar12->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pHVar6 = (pvVar12->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pHVar15 != pHVar6) {
        type.id = (long)pFVar5 - (long)pFVar4 >> 4;
        do {
          superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar15->id;
          pSVar13 = StructValuesMap<wasm::LUBFinder>::operator[]
                              (combinedInfos,
                               (HeapType)
                               superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload
                               .super__Optional_payload_base<wasm::HeapType>._8_8_);
          if (pFVar5 != pFVar4) {
            uVar16 = 0;
            uVar18 = 1;
            do {
              pLVar2 = (pSVar13->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                       super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl
                       .super__Vector_impl_data._M_start;
              if (((ulong)((long)(pSVar13->
                                 super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                                 super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
                   uVar16) ||
                 (pLVar7 = (pSVar9->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>)
                           .super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                 (ulong)((long)(pSVar9->
                               super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                               super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7 >> 3) <=
                 uVar16)) goto LAB_00ae250a;
              TVar3.id = pLVar2[uVar16].lub.id;
              TVar11 = wasm::Type::getLeastUpperBound(TVar3,pLVar7[uVar16].lub.id);
              pLVar2[uVar16].lub.id = TVar11.id;
              if (TVar3.id != TVar11.id) {
                UniqueDeferredQueue<wasm::HeapType>::push
                          ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128,
                           (HeapType)
                           superType.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._8_8_);
              }
              bVar8 = uVar18 < type.id;
              uVar16 = uVar18;
              uVar18 = (ulong)((int)uVar18 + 1);
            } while (bVar8);
          }
          pHVar15 = pHVar15 + 1;
        } while (pHVar15 != pHVar6);
      }
    }
  } while( true );
}

Assistant:

void propagate(StructValuesMap<T>& combinedInfos,
                 bool toSubTypes,
                 bool toSuperTypes) {
    UniqueDeferredQueue<HeapType> work;
    for (auto& [type, _] : combinedInfos) {
      work.push(type);
    }
    while (!work.empty()) {
      auto type = work.pop();
      auto& infos = combinedInfos[type];

      if (toSuperTypes) {
        // Propagate shared fields to the supertype.
        if (auto superType = type.getDeclaredSuperType()) {
          auto& superInfos = combinedInfos[*superType];
          auto& superFields = superType->getStruct().fields;
          for (Index i = 0; i < superFields.size(); i++) {
            if (superInfos[i].combine(infos[i])) {
              work.push(*superType);
            }
          }
        }
      }

      if (toSubTypes) {
        // Propagate shared fields to the subtypes.
        auto numFields = type.getStruct().fields.size();
        for (auto subType : subTypes.getImmediateSubTypes(type)) {
          auto& subInfos = combinedInfos[subType];
          for (Index i = 0; i < numFields; i++) {
            if (subInfos[i].combine(infos[i])) {
              work.push(subType);
            }
          }
        }
      }
    }
  }